

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  size_type *psVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  bool bVar5;
  _Alloc_hider *p_Var6;
  char cVar7;
  int iVar8;
  _Node *p_Var9;
  _Node **pp_Var10;
  char *pcVar11;
  ulong *puVar12;
  ulong uVar13;
  string *psVar14;
  char *pcVar15;
  _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_00;
  string *__s2;
  size_type sVar16;
  _Node **pp_Var17;
  _Node *p_Var18;
  _Node **pp_Var19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  pointer local_38;
  
  pcVar15 = (full_name->_M_dataplus)._M_p;
  cVar7 = *pcVar15;
  if (cVar7 == '\0') {
    uVar20 = 0;
  }
  else {
    uVar20 = 0;
    pcVar11 = pcVar15;
    do {
      pcVar11 = pcVar11 + 1;
      uVar20 = (long)cVar7 + uVar20 * 5;
      cVar7 = *pcVar11;
    } while (cVar7 != '\0');
  }
  uVar2 = (this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  uVar13 = uVar20 % uVar2;
  p_Var9 = (this->symbols_by_name_).
           super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
           .
           super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
           .
           super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ._M_buckets[uVar13];
  __s2 = full_name;
  while( true ) {
    if (p_Var9 == (_Node *)0x0) {
      uVar3 = (this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_element_count;
      if ((this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_rehash_policy._M_next_resize < uVar3 + 1) {
        fVar22 = (this->symbols_by_name_).
                 super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                 .
                 super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                 .
                 super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 ._M_rehash_policy._M_max_load_factor;
        fVar23 = ((float)uVar3 + 1.0) / fVar22;
        fVar21 = (float)uVar2;
        bVar5 = fVar21 < fVar23;
        if (fVar23 <= fVar21) {
          this_00 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     *)0x0;
        }
        else {
          fVar21 = fVar21 * (this->symbols_by_name_).
                            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                            .
                            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                            .
                            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                            ._M_rehash_policy._M_growth_factor;
          if (fVar21 <= fVar23) {
            fVar21 = fVar23;
          }
          fVar21 = ceilf(fVar21);
          psVar14 = (string *)0x12f;
          puVar12 = &std::tr1::__detail::__prime_list;
          do {
            __s2 = (string *)((ulong)psVar14 >> 1);
            p_Var6 = &psVar14->_M_dataplus;
            psVar14 = __s2;
            if (puVar12[(long)__s2] <
                (ulong)((long)(fVar21 - 9.223372e+18) & (long)fVar21 >> 0x3f | (long)fVar21)) {
              puVar12 = puVar12 + (long)__s2 + 1;
              psVar14 = (string *)((long)&p_Var6->_M_p + ~(ulong)__s2);
            }
          } while (0 < (long)psVar14);
          this_00 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     *)*puVar12;
          fVar21 = (float)this_00;
        }
        fVar22 = ceilf(fVar22 * fVar21);
        (this->symbols_by_name_).
        super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_rehash_policy._M_next_resize =
             (long)(fVar22 - 9.223372e+18) & (long)fVar22 >> 0x3f | (long)fVar22;
      }
      else {
        bVar5 = false;
        this_00 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)0x0;
      }
      p_Var9 = (_Node *)operator_new(0x20);
      (p_Var9->_M_v).first = pcVar15;
      (p_Var9->_M_v).second.type = symbol.type;
      (p_Var9->_M_v).second.field_1 = symbol.field_1;
      p_Var9->_M_next =
           (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
            *)0x0;
      if (bVar5) {
        uVar13 = uVar20 % (ulong)this_00;
        pp_Var10 = std::tr1::
                   _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ::_M_allocate_buckets(this_00,(size_type)__s2);
        pp_Var17 = (this->symbols_by_name_).
                   super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                   .
                   super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                   .
                   super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ._M_buckets;
        sVar4 = (this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_bucket_count;
        if (sVar4 != 0) {
          sVar16 = 0;
          do {
            p_Var18 = pp_Var17[sVar16];
            if (p_Var18 != (_Node *)0x0) {
              pp_Var19 = pp_Var17 + sVar16;
              do {
                pcVar15 = (p_Var18->_M_v).first;
                cVar7 = *pcVar15;
                if (cVar7 == '\0') {
                  uVar20 = 0;
                }
                else {
                  uVar20 = 0;
                  do {
                    pcVar15 = pcVar15 + 1;
                    uVar20 = (long)cVar7 + uVar20 * 5;
                    cVar7 = *pcVar15;
                  } while (cVar7 != '\0');
                }
                *pp_Var19 = p_Var18->_M_next;
                p_Var18->_M_next = pp_Var10[uVar20 % (ulong)this_00];
                pp_Var10[uVar20 % (ulong)this_00] = p_Var18;
                pp_Var17 = (this->symbols_by_name_).
                           super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                           .
                           super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                           .
                           super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                           ._M_buckets;
                pp_Var19 = pp_Var17 + sVar16;
                p_Var18 = *pp_Var19;
              } while (p_Var18 != (_Node *)0x0);
            }
            sVar16 = sVar16 + 1;
          } while (sVar16 != sVar4);
        }
        operator_delete(pp_Var17,sVar4 * 8 + 8);
        (this->symbols_by_name_).
        super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_bucket_count = (size_type)this_00;
        (this->symbols_by_name_).
        super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_buckets = pp_Var10;
      }
      else {
        pp_Var10 = (this->symbols_by_name_).
                   super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                   .
                   super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                   .
                   super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ._M_buckets;
      }
      p_Var9->_M_next = pp_Var10[uVar13];
      pp_Var10[uVar13] = p_Var9;
      psVar1 = &(this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_element_count;
      *psVar1 = *psVar1 + 1;
      local_38 = (full_name->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_
                 ,&local_38);
      return true;
    }
    __s2 = (string *)(p_Var9->_M_v).first;
    iVar8 = strcmp(pcVar15,(char *)__s2);
    if (iVar8 == 0) break;
    p_Var9 = p_Var9->_M_next;
  }
  return false;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(
    const string& full_name, Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}